

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator::init<Kernel::Literal*>
          (FastInstancesIterator *this,SubstitutionTree<Indexing::LiteralClause> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  int iVar1;
  VirtualIterator<Indexing::LiteralClause_*> VStack_38;
  
  this->_retrieveSubstitution = retrieveSubstitution;
  iVar1 = (*root->_vptr_Node[2])(root);
  this->_inLeaf = SUB41(iVar1,0);
  if (SUB41(iVar1,0) == false) {
    Lib::VirtualIterator<Indexing::LiteralClause_*>::getEmpty();
  }
  else {
    (*root->_vptr_Node[8])(&VStack_38,root);
  }
  Lib::VirtualIterator<Indexing::LiteralClause_*>::operator=(&this->_ldIterator,&VStack_38);
  Lib::VirtualIterator<Indexing::LiteralClause_*>::~VirtualIterator(&VStack_38);
  this->_root = root;
  SubstitutionTree<Indexing::LiteralClause>::InstMatcher::reset(&this->_subst);
  createBindings<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator::init<Kernel::Literal*>(Indexing::SubstitutionTree<Indexing::LiteralClause>*,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*,Kernel::Literal*,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
            (parent,query,reversed,(anon_class_8_1_8991fb9c)this);
  if (this->_inLeaf == true) {
    Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
              (&(this->_subst)._derefBindings);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;
        _iterCntr = parent->_iterCnt;
        _subst.reset();

        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });

        if (_inLeaf) {
          _subst.onLeafEntered(); //we reset the bindings cache
        }
      }